

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.h
# Opt level: O0

error_code_t *
base64::encode_impl<base64::def_encoding_t>
          (error_code_t *__return_storage_ptr__,const_adapter_t *raw_data,
          mutable_adapter_t *base64_data)

{
  uint8_t uVar1;
  uint uVar2;
  size_t raw_size_00;
  size_t required_size;
  size_t obtained_size;
  uchar *puVar3;
  uchar *puVar4;
  long lVar5;
  byte local_83;
  byte local_82;
  byte local_81;
  size_t tail_size;
  uint32_t triple;
  uint32_t octet_c;
  uint32_t octet_b;
  uint32_t octet_a;
  size_t j;
  size_t i;
  uint8_t *base64_ptr;
  uint8_t *raw_ptr;
  size_t base64_size;
  size_t encoded_size;
  size_t raw_size;
  mutable_adapter_t *base64_data_local;
  const_adapter_t *raw_data_local;
  
  raw_size_00 = adapter_t<const_unsigned_char>::size(raw_data);
  required_size = calc_encoded_size_impl<base64::def_encoding_t>(raw_size_00);
  obtained_size = adapter_t<unsigned_char>::size(base64_data);
  if (obtained_size < required_size) {
    detail::insufficient_buffer_size_error(__return_storage_ptr__,obtained_size,required_size);
  }
  else {
    puVar3 = adapter_t<const_unsigned_char>::data(raw_data);
    puVar4 = adapter_t<unsigned_char>::data(base64_data);
    j = 0;
    _octet_b = 0;
    while (j < raw_size_00) {
      if (j < raw_size_00) {
        local_81 = puVar3[j];
        j = j + 1;
      }
      else {
        local_81 = 0;
      }
      if (j < raw_size_00) {
        local_82 = puVar3[j];
        j = j + 1;
      }
      else {
        local_82 = 0;
      }
      if (j < raw_size_00) {
        local_83 = puVar3[j];
        j = j + 1;
      }
      else {
        local_83 = 0;
      }
      uVar2 = (uint)local_81 * 0x10000 + (uint)local_82 * 0x100 + (uint)local_83;
      uVar1 = def_encoding_t::char_at((ulong)(uVar2 >> 0x12 & 0x3f));
      puVar4[_octet_b] = uVar1;
      uVar1 = def_encoding_t::char_at((ulong)(uVar2 >> 0xc & 0x3f));
      puVar4[_octet_b + 1] = uVar1;
      uVar1 = def_encoding_t::char_at((ulong)(uVar2 >> 6 & 0x3f));
      lVar5 = _octet_b + 3;
      puVar4[_octet_b + 2] = uVar1;
      uVar1 = def_encoding_t::char_at((ulong)(uVar2 & 0x3f));
      _octet_b = _octet_b + 4;
      puVar4[lVar5] = uVar1;
    }
    if (raw_size_00 % 3 == 2) {
      uVar1 = def_encoding_t::pad();
      puVar4[required_size - 1] = uVar1;
    }
    else if (raw_size_00 % 3 == 1) {
      uVar1 = def_encoding_t::pad();
      puVar4[required_size - 1] = uVar1;
      uVar1 = def_encoding_t::pad();
      puVar4[required_size - 2] = uVar1;
    }
    memset(__return_storage_ptr__,0,0x28);
    error_code_t::error_code_t(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

error_code_t encode_impl(
        const const_adapter_t       & raw_data,
        const mutable_adapter_t     & base64_data)
    {
        const size_t raw_size = raw_data.size();
        const size_t encoded_size = calc_encoded_size_impl<encoding_traits>(raw_size);
        const size_t base64_size = base64_data.size();

        if (base64_size < encoded_size)
        {
            return detail::insufficient_buffer_size_error(base64_size, encoded_size);
        }

        const uint8_t * raw_ptr = raw_data.data();
        uint8_t * base64_ptr = base64_data.data();

        for (size_t i = 0, j = 0; i < raw_size;)
        {
            uint32_t octet_a = i < raw_size ? raw_ptr[i++] : uint8_t{ 0 };
            uint32_t octet_b = i < raw_size ? raw_ptr[i++] : uint8_t{ 0 };
            uint32_t octet_c = i < raw_size ? raw_ptr[i++] : uint8_t{ 0 };

            uint32_t triple = (octet_a << 0x10) + (octet_b << 0x08) + octet_c;

            base64_ptr[j++] = encoding_traits::char_at((triple >> 3 * 6) & 0x3F);
            base64_ptr[j++] = encoding_traits::char_at((triple >> 2 * 6) & 0x3F);
            base64_ptr[j++] = encoding_traits::char_at((triple >> 1 * 6) & 0x3F);
            base64_ptr[j++] = encoding_traits::char_at((triple >> 0 * 6) & 0x3F);
        }

        if constexpr (encoding_traits::has_pad())
        {
            const size_t tail_size = raw_size % 3;

            if (tail_size == 2)
            {
                base64_ptr[encoded_size - 1] = encoding_traits::pad();
            }
            else if (tail_size == 1)
            {
                base64_ptr[encoded_size - 1] = encoding_traits::pad();
                base64_ptr[encoded_size - 2] = encoding_traits::pad();
            }
        }

        return error_code_t{};
    }